

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O1

void __thiscall
cbtDbvt::collideTVNoStackAlloc
          (cbtDbvt *this,cbtDbvtNode *root,cbtDbvtVolume *vol,cbtNodeStack *stack,ICollide *policy)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  cbtDbvtNode *pcVar7;
  int iVar8;
  cbtDbvtNode **ppcVar9;
  int iVar10;
  long lVar11;
  
  if (root != (cbtDbvtNode *)0x0) {
    fVar1 = (vol->mi).m_floats[0];
    fVar2 = (vol->mi).m_floats[1];
    fVar3 = (vol->mi).m_floats[2];
    fVar4 = (vol->mx).m_floats[0];
    fVar5 = (vol->mx).m_floats[1];
    fVar6 = (vol->mx).m_floats[2];
    iVar8 = stack->m_size;
    lVar11 = (long)iVar8;
    if ((lVar11 < 1) && (iVar8 < 0)) {
      if (stack->m_capacity < 0) {
        if (stack->m_data != (cbtDbvtNode **)0x0) {
          if (stack->m_ownsMemory == true) {
            cbtAlignedFreeInternal(stack->m_data);
          }
          stack->m_data = (cbtDbvtNode **)0x0;
        }
        stack->m_ownsMemory = true;
        stack->m_data = (cbtDbvtNode **)0x0;
        stack->m_capacity = 0;
      }
      if (iVar8 < 0) {
        do {
          stack->m_data[lVar11] = (cbtDbvtNode *)0x0;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0);
      }
    }
    stack->m_size = 0;
    if (stack->m_capacity < 0x40) {
      ppcVar9 = (cbtDbvtNode **)cbtAlignedAllocInternal(0x200,0x10);
      iVar8 = stack->m_size;
      if (0 < (long)iVar8) {
        lVar11 = 0;
        do {
          ppcVar9[lVar11] = stack->m_data[lVar11];
          lVar11 = lVar11 + 1;
        } while (iVar8 != lVar11);
      }
      if (stack->m_data != (cbtDbvtNode **)0x0) {
        if (stack->m_ownsMemory == true) {
          cbtAlignedFreeInternal(stack->m_data);
        }
        stack->m_data = (cbtDbvtNode **)0x0;
      }
      stack->m_ownsMemory = true;
      stack->m_data = ppcVar9;
      stack->m_capacity = 0x40;
    }
    iVar8 = stack->m_size;
    if (iVar8 == stack->m_capacity) {
      iVar10 = 1;
      if (iVar8 != 0) {
        iVar10 = iVar8 * 2;
      }
      if (stack->m_capacity < iVar10) {
        if (iVar10 == 0) {
          ppcVar9 = (cbtDbvtNode **)0x0;
        }
        else {
          ppcVar9 = (cbtDbvtNode **)cbtAlignedAllocInternal((long)iVar10 << 3,0x10);
        }
        iVar8 = stack->m_size;
        if (0 < (long)iVar8) {
          lVar11 = 0;
          do {
            ppcVar9[lVar11] = stack->m_data[lVar11];
            lVar11 = lVar11 + 1;
          } while (iVar8 != lVar11);
        }
        if (stack->m_data != (cbtDbvtNode **)0x0) {
          if (stack->m_ownsMemory == true) {
            cbtAlignedFreeInternal(stack->m_data);
          }
          stack->m_data = (cbtDbvtNode **)0x0;
        }
        stack->m_ownsMemory = true;
        stack->m_data = ppcVar9;
        stack->m_capacity = iVar10;
      }
    }
    iVar8 = stack->m_size;
    stack->m_data[iVar8] = root;
    stack->m_size = iVar8 + 1;
    do {
      pcVar7 = stack->m_data[(long)stack->m_size + -1];
      iVar8 = stack->m_size + -1;
      stack->m_size = iVar8;
      if (((((pcVar7->volume).mi.m_floats[0] <= fVar4) && (fVar1 <= (pcVar7->volume).mx.m_floats[0])
           ) && ((pcVar7->volume).mi.m_floats[1] <= fVar5)) &&
         (((fVar2 <= (pcVar7->volume).mx.m_floats[1] && ((pcVar7->volume).mi.m_floats[2] <= fVar6))
          && (fVar3 <= (pcVar7->volume).mx.m_floats[2])))) {
        if ((pcVar7->field_2).childs[1] == (cbtDbvtNode *)0x0) {
          (*policy->_vptr_ICollide[3])(policy,pcVar7);
        }
        else {
          if (iVar8 == stack->m_capacity) {
            iVar10 = iVar8 * 2;
            if (iVar8 == 0) {
              iVar10 = 1;
            }
            if (stack->m_capacity < iVar10) {
              if (iVar10 == 0) {
                ppcVar9 = (cbtDbvtNode **)0x0;
              }
              else {
                ppcVar9 = (cbtDbvtNode **)cbtAlignedAllocInternal((long)iVar10 << 3,0x10);
              }
              iVar8 = stack->m_size;
              if (0 < (long)iVar8) {
                lVar11 = 0;
                do {
                  ppcVar9[lVar11] = stack->m_data[lVar11];
                  lVar11 = lVar11 + 1;
                } while (iVar8 != lVar11);
              }
              if (stack->m_data != (cbtDbvtNode **)0x0) {
                if (stack->m_ownsMemory == true) {
                  cbtAlignedFreeInternal(stack->m_data);
                }
                stack->m_data = (cbtDbvtNode **)0x0;
              }
              stack->m_ownsMemory = true;
              stack->m_data = ppcVar9;
              stack->m_capacity = iVar10;
            }
          }
          iVar8 = stack->m_size;
          stack->m_data[iVar8] = (pcVar7->field_2).childs[0];
          iVar8 = iVar8 + 1;
          stack->m_size = iVar8;
          if (iVar8 == stack->m_capacity) {
            iVar10 = iVar8 * 2;
            if (iVar8 == 0) {
              iVar10 = 1;
            }
            if (stack->m_capacity < iVar10) {
              if (iVar10 == 0) {
                ppcVar9 = (cbtDbvtNode **)0x0;
              }
              else {
                ppcVar9 = (cbtDbvtNode **)cbtAlignedAllocInternal((long)iVar10 << 3,0x10);
              }
              iVar8 = stack->m_size;
              if (0 < (long)iVar8) {
                lVar11 = 0;
                do {
                  ppcVar9[lVar11] = stack->m_data[lVar11];
                  lVar11 = lVar11 + 1;
                } while (iVar8 != lVar11);
              }
              if (stack->m_data != (cbtDbvtNode **)0x0) {
                if (stack->m_ownsMemory == true) {
                  cbtAlignedFreeInternal(stack->m_data);
                }
                stack->m_data = (cbtDbvtNode **)0x0;
              }
              stack->m_ownsMemory = true;
              stack->m_data = ppcVar9;
              stack->m_capacity = iVar10;
            }
          }
          iVar8 = stack->m_size;
          stack->m_data[iVar8] = (pcVar7->field_2).childs[1];
          stack->m_size = iVar8 + 1;
        }
      }
    } while (0 < stack->m_size);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::collideTVNoStackAlloc(const cbtDbvtNode* root,
										  const cbtDbvtVolume& vol,
										  cbtNodeStack& stack,
										  DBVT_IPOLICY) const
{
	DBVT_CHECKTYPE
	if (root)
	{
		ATTRIBUTE_ALIGNED16(cbtDbvtVolume)
		volume(vol);
		stack.resize(0);
		stack.reserve(SIMPLE_STACKSIZE);
		stack.push_back(root);
		do
		{
			const cbtDbvtNode* n = stack[stack.size() - 1];
			stack.pop_back();
			if (Intersect(n->volume, volume))
			{
				if (n->isinternal())
				{
					stack.push_back(n->childs[0]);
					stack.push_back(n->childs[1]);
				}
				else
				{
					policy.Process(n);
				}
			}
		} while (stack.size() > 0);
	}
}